

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_dialer_init(void *arg,nng_url *url,nni_dialer *ndialer)

{
  nni_sock *sock_00;
  nni_sock *sock;
  int rv;
  udp_ep *ep;
  nni_dialer *ndialer_local;
  nng_url *url_local;
  void *arg_local;
  
  sock_00 = nni_dialer_sock(ndialer);
  *(nni_dialer **)((long)arg + 0x3f8) = ndialer;
  arg_local._4_4_ = udp_ep_init((udp_ep *)arg,url,sock_00,ndialer,(nni_listener *)0x0);
  if ((arg_local._4_4_ == 0) && (arg_local._4_4_ = udp_check_url(url,false), arg_local._4_4_ == 0))
  {
    arg_local._4_4_ = 0;
  }
  return arg_local._4_4_;
}

Assistant:

static int
udp_dialer_init(void *arg, nng_url *url, nni_dialer *ndialer)
{
	udp_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_dialer_sock(ndialer);

	ep->ndialer = ndialer;
	if ((rv = udp_ep_init(ep, url, sock, ndialer, NULL)) != 0) {
		return (rv);
	}

	if ((rv = udp_check_url(url, false)) != 0) {
		return (rv);
	}

	return (0);
}